

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void leveldb::AppendEscapedStringTo(string *str,Slice *value)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_FS_OFFSET;
  char c;
  size_t i;
  char buf [10];
  Slice *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char local_12 [10];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    this = pbVar3;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Slice::size(in_stack_ffffffffffffffb8);
    if (pbVar2 <= pbVar3) break;
    bVar1 = Slice::operator[]((Slice *)in_RSI,(size_t)this);
    if (((char)bVar1 < ' ') || ('~' < (char)bVar1)) {
      snprintf(local_12,10,"\\x%02x",(ulong)bVar1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (in_RSI,(char *)this);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (this,(char)((ulong)in_RSI >> 0x38));
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&(this->_M_dataplus)._M_p + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AppendEscapedStringTo(std::string* str, const Slice& value) {
  for (size_t i = 0; i < value.size(); i++) {
    char c = value[i];
    if (c >= ' ' && c <= '~') {
      str->push_back(c);
    } else {
      char buf[10];
      snprintf(buf, sizeof(buf), "\\x%02x",
               static_cast<unsigned int>(c) & 0xff);
      str->append(buf);
    }
  }
}